

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool wasm::tooCostlyToRunUnconditionally(PassOptions *passOptions,Index cost)

{
  Index cost_local;
  PassOptions *passOptions_local;
  
  if (passOptions->shrinkLevel == 0) {
    passOptions_local._7_1_ = 4 < cost;
  }
  else {
    if (passOptions->shrinkLevel != 1) {
      handle_unreachable("bad shrink level",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                         ,0x73);
    }
    passOptions_local._7_1_ = 7 < cost;
  }
  return passOptions_local._7_1_;
}

Assistant:

static bool tooCostlyToRunUnconditionally(const PassOptions& passOptions,
                                          Index cost) {
  if (passOptions.shrinkLevel == 0) {
    // We are focused on speed. Any extra cost is risky, but allow a small
    // amount.
    return cost > TooCostlyToRunUnconditionally / 2;
  } else if (passOptions.shrinkLevel == 1) {
    // We are optimizing for size in a balanced manner. Allow some extra
    // overhead here.
    return cost >= TooCostlyToRunUnconditionally;
  } else {
    // We should have already decided what to do if shrink_level=2 and not
    // gotten here, and other values are invalid.
    WASM_UNREACHABLE("bad shrink level");
  }
}